

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O1

int64_t gguf_remove_key(gguf_context *ctx,char *key)

{
  int64_t iVar1;
  
  iVar1 = gguf_find_key(ctx,key);
  if (-1 < iVar1) {
    std::vector<gguf_kv,_std::allocator<gguf_kv>_>::_M_erase
              (&ctx->kv,(ctx->kv).super__Vector_base<gguf_kv,_std::allocator<gguf_kv>_>._M_impl.
                        super__Vector_impl_data._M_start + iVar1);
  }
  return iVar1;
}

Assistant:

int64_t gguf_remove_key(struct gguf_context * ctx, const char * key) {
    const int64_t key_id = gguf_find_key(ctx, key);
    if (key_id >= 0) {
        ctx->kv.erase(ctx->kv.begin() + key_id);
    }
    return key_id;
}